

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2BigCountedRepetition(void)

{
  once_flag *this;
  bool bVar1;
  ostream *poVar2;
  LogMessage local_450;
  StringPiece local_2d0;
  string local_2c0 [8];
  string s;
  LogMessage local_2a0;
  StringPiece local_110;
  undefined1 local_100 [8];
  RE2 re;
  Options opt;
  
  this = &re.named_groups_once_;
  RE2::Options::Options((Options *)this);
  RE2::Options::set_max_mem((Options *)this,0x10000000);
  StringPiece::StringPiece(&local_110,".{512}x");
  RE2::RE2((RE2 *)local_100,&local_110,(Options *)this);
  bVar1 = RE2::ok((RE2 *)local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b3);
    poVar2 = LogMessage::stream(&local_2a0);
    std::operator<<(poVar2,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
  }
  std::__cxx11::string::string(local_2c0);
  std::__cxx11::string::append((ulong)local_2c0,'\x03');
  std::__cxx11::string::append((char *)local_2c0);
  StringPiece::StringPiece(&local_2d0,(string *)local_2c0);
  bVar1 = RE2::PartialMatch<>(&local_2d0,(RE2 *)local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_450,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4b7);
    poVar2 = LogMessage::stream(&local_450);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(s, re)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_450);
  }
  std::__cxx11::string::~string(local_2c0);
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

TEST(RE2, BigCountedRepetition) {
  // Test that counted repetition works, given tons of memory.
  RE2::Options opt;
  opt.set_max_mem(256<<20);

  RE2 re(".{512}x", opt);
  CHECK(re.ok());
  string s;
  s.append(515, 'c');
  s.append("x");
  CHECK(RE2::PartialMatch(s, re));
}